

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_handler.hpp
# Opt level: O2

void asio::detail::
     wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/MauProxy.cpp:310:32)>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  Lock *this;
  DeliveryCommonData *pDVar1;
  QueueNode *ptr;
  MauSendHookFunction p_Var2;
  basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *pbVar3;
  long lVar4;
  anon_class_8_1_8991fb9c this_00;
  bool bVar5;
  OutputWorker *this_01;
  uint64_t uVar6;
  reactive_socket_sendto_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  *this_02;
  uint16_t uVar7;
  base_implementation_type *impl;
  undefined1 local_228 [20];
  UDPAddress destAddress;
  mutable_buffers_1 local_1f8;
  binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:310:32),_std::error_code>
  handler;
  ptr local_1d0;
  Locker locker;
  ostringstream aoStack_1a8 [8];
  ulong local_1a0;
  
  local_1d0.h = &handler.handler_;
  handler.handler_.this = *(DeliveryChannel **)&base[1].task_result_;
  handler.arg1_._0_8_ = base[1].next_;
  handler.arg1_._M_cat = (error_category *)base[1].func_;
  local_1d0.v = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:310:32)>
                 *)base;
  local_1d0.p = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:310:32)>
                 *)base;
  wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/MauProxy.cpp:310:32)>
  ::ptr::reset(&local_1d0);
  this_00.this = handler.handler_.this;
  if (owner != (void *)0x0) {
    this = &(handler.handler_.this)->QueueLock;
    locker.TheLock = this;
    std::recursive_mutex::lock(&this->cs);
    (this_00.this)->NextTimerWakeUsec = 0;
    mau::Locker::~Locker(&locker);
    if (handler.arg1_._M_value == 0) {
      mau::LockedValue<asio::ip::basic_endpoint<asio::ip::udp>_>::Get
                (&destAddress,&(this_00.this)->DeliveryAddress);
      if (destAddress.impl_.data_.base.sa_family != 2) {
        local_1a0 = (ulong)destAddress.impl_.data_.v6.sin6_scope_id;
        aoStack_1a8[0] = (ostringstream)destAddress.impl_.data_._16_1_;
        aoStack_1a8[1] = (ostringstream)destAddress.impl_.data_._17_1_;
        aoStack_1a8[2] = (ostringstream)destAddress.impl_.data_._18_1_;
        aoStack_1a8[3] = (ostringstream)destAddress.impl_.data_._19_1_;
        aoStack_1a8[4] = (ostringstream)destAddress.impl_.data_._20_1_;
        aoStack_1a8[5] = (ostringstream)destAddress.impl_.data_._21_1_;
        aoStack_1a8[6] = (ostringstream)destAddress.impl_.data_._22_1_;
        aoStack_1a8[7] = (ostringstream)destAddress.impl_.data_._23_1_;
        destAddress.impl_.data_.v6.sin6_flowinfo = 0;
      }
      else {
        local_1a0 = 0;
        aoStack_1a8[0] = (ostringstream)0x0;
        aoStack_1a8[1] = (ostringstream)0x0;
        aoStack_1a8[2] = (ostringstream)0x0;
        aoStack_1a8[3] = (ostringstream)0x0;
        aoStack_1a8[4] = (ostringstream)0x0;
        aoStack_1a8[5] = (ostringstream)0x0;
        aoStack_1a8[6] = (ostringstream)0x0;
        aoStack_1a8[7] = (ostringstream)0x0;
      }
      locker.TheLock._4_4_ = destAddress.impl_.data_.v6.sin6_flowinfo;
      locker.TheLock._0_4_ = (uint)(destAddress.impl_.data_.base.sa_family != 2);
      bVar5 = ip::address::is_unspecified((address *)&locker);
      if (bVar5) {
        pDVar1 = (this_00.this)->Common;
        if ((int)(pDVar1->Logger).ChannelMinLevel < 3) {
          locker.TheLock = (Lock *)(pDVar1->Logger).ChannelName;
          std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
          std::operator<<((ostream *)aoStack_1a8,(string *)&(pDVar1->Logger).Prefix);
          std::operator<<((ostream *)aoStack_1a8,"Delivery address unspecified - Abort");
          this_01 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(this_01,(LogStringBuffer *)&locker);
          std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
        }
      }
      else {
        uVar6 = mau::GetTimeUsec();
        while( true ) {
          locker.TheLock = this;
          std::recursive_mutex::lock(&this->cs);
          ptr = ((this_00.this)->Queue).Head;
          if ((ptr == (QueueNode *)0x0) || ((long)(uVar6 - ptr->DeliveryUsec) < 0)) break;
          mau::PacketQueue::Pop(&(this_00.this)->Queue);
          mau::Locker::~Locker(&locker);
          pDVar1 = (this_00.this)->Common;
          p_Var2 = (pDVar1->ProxyConfig).SendHook;
          if (p_Var2 == (MauSendHookFunction)0x0) {
            local_1f8.super_mutable_buffer.size_ = (size_t)ptr->Bytes;
            pbVar3 = (pDVar1->Socket)._M_t.
                     super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                     .
                     super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
                     ._M_head_impl;
            local_228._0_8_ = this_00.this;
            locker.TheLock = (Lock *)local_228;
            lVar4 = *(long *)&(pbVar3->
                              super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                              ).
                              super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>
            ;
            local_228._8_8_ = ptr;
            local_1f8.super_mutable_buffer.data_ = ptr->Data;
            this_02 = (reactive_socket_sendto_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
                       *)asio_handler_allocate(0x80);
            impl = (base_implementation_type *)
                   ((long)&(pbVar3->
                           super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                           ).
                           super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>
                   + 8);
            aoStack_1a8[0] = (ostringstream)0x0;
            aoStack_1a8[1] = (ostringstream)0x0;
            aoStack_1a8[2] = (ostringstream)0x0;
            aoStack_1a8[3] = (ostringstream)0x0;
            aoStack_1a8[4] = (ostringstream)0x0;
            aoStack_1a8[5] = (ostringstream)0x0;
            aoStack_1a8[6] = (ostringstream)0x0;
            aoStack_1a8[7] = (ostringstream)0x0;
            reactive_socket_sendto_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
            ::reactive_socket_sendto_op_base
                      (this_02,impl->socket_,&local_1f8,&destAddress,0,
                       reactive_socket_sendto_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/MauProxy.cpp:374:34)>
                       ::do_complete);
            this_02[1].super_reactor_op.super_operation.next_ =
                 (scheduler_operation *)local_228._0_8_;
            this_02[1].super_reactor_op.super_operation.func_ = (func_type)local_228._8_8_;
            aoStack_1a8 = (ostringstream  [8])this_02;
            reactive_socket_service_base::start_op
                      ((reactive_socket_service_base *)(lVar4 + 0x28),impl,1,(reactor_op *)this_02,
                       false,true,false);
            aoStack_1a8[0] = (ostringstream)0x0;
            aoStack_1a8[1] = (ostringstream)0x0;
            aoStack_1a8[2] = (ostringstream)0x0;
            aoStack_1a8[3] = (ostringstream)0x0;
            aoStack_1a8[4] = (ostringstream)0x0;
            aoStack_1a8[5] = (ostringstream)0x0;
            aoStack_1a8[6] = (ostringstream)0x0;
            aoStack_1a8[7] = (ostringstream)0x0;
            reactive_socket_sendto_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/MauProxy.cpp:374:34)>
            ::ptr::~ptr((ptr *)&locker);
          }
          else {
            uVar7 = swap_bytes(destAddress.impl_.data_.v4.sin_port);
            (*p_Var2)((pDVar1->ProxyConfig).SendHookContext,uVar7,ptr->Data,ptr->Bytes);
            pDVar1 = (this_00.this)->Common;
            locker.TheLock = &(pDVar1->ReadBufferAllocator).AllocatorLock;
            std::recursive_mutex::lock(&(locker.TheLock)->cs);
            pktalloc::Allocator::Free(&(pDVar1->ReadBufferAllocator).Allocator,(uint8_t *)ptr);
            mau::Locker::~Locker(&locker);
          }
        }
        mau::Locker::~Locker(&locker);
        mau::DeliveryChannel::postNextTimer(this_00.this);
      }
    }
  }
  wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/MauProxy.cpp:310:32)>
  ::ptr::~ptr(&local_1d0);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    wait_handler* h(static_cast<wait_handler*>(base));
    ptr p = { asio::detail::addressof(h->handler_), h, h };
    handler_work<Handler> w(h->handler_);

    ASIO_HANDLER_COMPLETION((*h));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    detail::binder1<Handler, asio::error_code>
      handler(h->handler_, h->ec_);
    p.h = asio::detail::addressof(handler.handler_);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN((handler.arg1_));
      w.complete(handler, handler.handler_);
      ASIO_HANDLER_INVOCATION_END;
    }
  }